

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void __thiscall
flow_cutter::DistanceAwareCutter::
DistanceAwareCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
          (DistanceAwareCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph)

{
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *in_stack_00000018;
  BasicCutter *in_stack_00000020;
  int in_stack_ffffffffffffff8c;
  ArrayIDFunc<int> *in_stack_ffffffffffffff90;
  
  BasicCutter::
  BasicCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
            (in_stack_00000020,in_stack_00000018);
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  ::node_count((Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *)0x17cec9);
  ArrayIDFunc<int>::ArrayIDFunc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  ::node_count((Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *)0x17cefc);
  ArrayIDFunc<int>::ArrayIDFunc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x17cf23);
  return;
}

Assistant:

DistanceAwareCutter(const Graph& graph)
        : cutter(graph)
        , node_dist { ArrayIDFunc<int> { graph.node_count() },
            ArrayIDFunc<int> { graph.node_count() } }
    {
    }